

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqllogic_test_runner.cpp
# Opt level: O0

void __thiscall duckdb::SQLLogicTestRunner::Reconnect(SQLLogicTestRunner *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  type pCVar1;
  ulong uVar2;
  long in_RDI;
  unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
  res1;
  ClientConfig *client_config;
  unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>
  *in_stack_fffffffffffffe98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  string *__rhs;
  DuckDB *in_stack_fffffffffffffeb8;
  string local_130 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffee8;
  string local_110 [8];
  string *in_stack_fffffffffffffef8;
  string local_f0 [8];
  long local_e8;
  allocator local_d9;
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [31];
  allocator local_39;
  string local_38 [32];
  string local_18 [24];
  
  unique_ptr<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>,_true>::operator*
            ((unique_ptr<duckdb::DuckDB,_std::default_delete<duckdb::DuckDB>,_true> *)
             in_stack_fffffffffffffea0);
  make_uniq<duckdb::Connection,duckdb::DuckDB&>(in_stack_fffffffffffffeb8);
  unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>::operator=
            ((unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true> *)
             in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>::~unique_ptr
            ((unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true> *)
             0x7bdee8);
  if ((*(byte *)(in_RDI + 0xf0) & 1) != 0) {
    unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>::operator->
              ((unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true> *)
               in_stack_fffffffffffffea0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"SET integer_division=true",&local_39);
    duckdb::Connection::Query(local_18);
    unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
    ::~unique_ptr((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                   *)0x7bdf63);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>::operator->
                    ((unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>
                      *)in_stack_fffffffffffffea0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"test_secret_dir",&local_d9);
  TestCreatePath(in_stack_fffffffffffffef8);
  std::operator+((char *)__lhs,in_stack_fffffffffffffea0);
  std::operator+(__lhs,(char *)in_stack_fffffffffffffea0);
  duckdb::Connection::Query(local_58);
  unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
  ::~unique_ptr((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                 *)0x7be084);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>::operator->
            ((unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true> *)
             in_stack_fffffffffffffea0);
  pCVar1 = shared_ptr<duckdb::ClientContext,_true>::operator*
                     ((shared_ptr<duckdb::ClientContext,_true> *)in_stack_fffffffffffffea0);
  local_e8 = duckdb::ClientConfig::GetConfig(pCVar1);
  *(undefined1 *)(local_e8 + 0x90) = 1;
  *(undefined1 *)(local_e8 + 0x91) = 0;
  if ((*(byte *)(in_RDI + 0xf2) & 1) != 0) {
    unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>::operator->
              ((unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true> *)
               in_stack_fffffffffffffea0);
    duckdb::Connection::EnableQueryVerification();
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true>::operator->
              ((unique_ptr<duckdb::Connection,_std::default_delete<duckdb::Connection>,_true> *)
               in_stack_fffffffffffffea0);
    __rhs = local_130;
    std::operator+(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    std::operator+(__lhs,(char *)__rhs);
    duckdb::Connection::Query(local_f0);
    std::__cxx11::string::~string(local_110);
    std::__cxx11::string::~string(local_130);
    unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
    ::~unique_ptr((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                   *)0x7be286);
  }
  return;
}

Assistant:

void SQLLogicTestRunner::Reconnect() {
	con = make_uniq<Connection>(*db);
	if (original_sqlite_test) {
		con->Query("SET integer_division=true");
	}
	con->Query("SET secret_directory='" + TestCreatePath("test_secret_dir") + "'");
#ifdef DUCKDB_ALTERNATIVE_VERIFY
	con->Query("SET pivot_filter_threshold=0");
#endif
	auto &client_config = ClientConfig::GetConfig(*con->context);
	client_config.enable_progress_bar = true;
	client_config.print_progress_bar = false;
	if (enable_verification) {
		con->EnableQueryVerification();
	}
	// Set the local extension repo for autoinstalling extensions
	if (!local_extension_repo.empty()) {
		auto res1 = con->Query("SET autoinstall_extension_repository='" + local_extension_repo + "'");
	}
}